

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

void __thiscall
leveldb::Version::AddIterators
          (Version *this,ReadOptions *options,
          vector<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_> *iters)

{
  pointer ppFVar1;
  FileMetaData *pFVar2;
  Iterator *in_RAX;
  int level;
  size_t i;
  ulong uVar3;
  long lVar4;
  Iterator *local_38;
  
  local_38 = in_RAX;
  for (uVar3 = 0;
      ppFVar1 = this->files_[0].
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)this->files_[0].
                            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar1 >> 3);
      uVar3 = uVar3 + 1) {
    pFVar2 = ppFVar1[uVar3];
    local_38 = TableCache::NewIterator
                         (this->vset_->table_cache_,options,pFVar2->number,pFVar2->file_size,
                          (Table **)0x0);
    std::vector<leveldb::Iterator*,std::allocator<leveldb::Iterator*>>::
    emplace_back<leveldb::Iterator*>
              ((vector<leveldb::Iterator*,std::allocator<leveldb::Iterator*>> *)iters,&local_38);
  }
  level = 1;
  for (lVar4 = 0x40; lVar4 != 0xd0; lVar4 = lVar4 + 0x18) {
    if (*(long *)((long)this->files_ + lVar4 + -0x28) !=
        *(long *)((long)this->files_ + lVar4 + -0x20)) {
      local_38 = NewConcatenatingIterator(this,options,level);
      std::vector<leveldb::Iterator*,std::allocator<leveldb::Iterator*>>::
      emplace_back<leveldb::Iterator*>
                ((vector<leveldb::Iterator*,std::allocator<leveldb::Iterator*>> *)iters,&local_38);
    }
    level = level + 1;
  }
  return;
}

Assistant:

void Version::AddIterators(const ReadOptions& options,
                           std::vector<Iterator*>* iters) {
  // Merge all level zero files together since they may overlap
  for (size_t i = 0; i < files_[0].size(); i++) {
    iters->push_back(vset_->table_cache_->NewIterator(
        options, files_[0][i]->number, files_[0][i]->file_size));
  }

  // For levels > 0, we can use a concatenating iterator that sequentially
  // walks through the non-overlapping files in the level, opening them
  // lazily.
  for (int level = 1; level < config::kNumLevels; level++) {
    if (!files_[level].empty()) {
      iters->push_back(NewConcatenatingIterator(options, level));
    }
  }
}